

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O2

Var Js::JavascriptReflect::EntryGetOwnPropertyDescriptor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  CallInfo CVar10;
  int32 hCode;
  int in_stack_00000010;
  uint local_90 [2];
  Type TStack_88;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  Var result;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x70,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bacbfd;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_40,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)__tag.entry.next,
             L"Reflect.getOwnPropertyDescriptor",&stack0x00000000);
  if ((auStack_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x75,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar4) goto LAB_00bacbfd;
    *puVar7 = 0;
  }
  if (((uint)auStack_40._0_4_ >> 0x18 & 1) != 0) {
    hCode = -0x7ff5ebf5;
LAB_00bacc05:
    JavascriptError::ThrowTypeError(pSVar2,hCode,L"Reflect.getOwnPropertyDescriptor");
  }
  hCode = -0x7ff5ec36;
  if ((auStack_40._0_4_ & 0xfffffe) == 0) goto LAB_00bacc05;
  pvVar8 = Arguments::operator[]((Arguments *)auStack_40,1);
  BVar5 = JavascriptOperators::IsObject(pvVar8);
  if (BVar5 == 0) goto LAB_00bacc05;
  pvVar8 = Arguments::operator[]((Arguments *)auStack_40,1);
  if (2 < (auStack_40._0_4_ & 0xffffff)) {
    result = Arguments::operator[]((Arguments *)auStack_40,2);
  }
  if (pvVar8 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00bacbfd;
    *puVar7 = 0;
  }
  bVar4 = TaggedInt::Is(pvVar8);
  if ((ulong)pvVar8 >> 0x32 == 0 && !bVar4) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00bacbfd;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar9->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
        local_90[0] = auStack_40._0_4_;
        local_90[1] = auStack_40._4_4_;
        TStack_88._0_4_ = args.super_Arguments.Info._0_4_;
        TStack_88._4_4_ = args.super_Arguments.Info._4_4_;
        iVar6 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])
                          (pRVar9,EntryGetOwnPropertyDescriptor,local_90,&callInfo_local);
        CVar10 = callInfo_local;
        if (iVar6 != 0) goto LAB_00bacbe2;
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(pRVar9);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00bacbfd:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
    }
  }
  pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
  CVar10 = (CallInfo)JavascriptObject::GetOwnPropertyDescriptorHelper(pRVar9,result,pSVar2);
LAB_00bacbe2:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
  return (Var)CVar10;
}

Assistant:

Var JavascriptReflect::EntryGetOwnPropertyDescriptor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.getOwnPropertyDescriptor"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.getOwnPropertyDescriptor"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.getOwnPropertyDescriptor"));
        }
        Var target = args[1];
        Var propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;

        if (JavascriptOperators::GetTypeId(target) == TypeIds_HostDispatch)
        {
            Var result;
            if (VarTo<RecyclableObject>(target)->InvokeBuiltInOperationRemotely(EntryGetOwnPropertyDescriptor, args, &result))
            {
                return result;
            }
        }

        return JavascriptObject::GetOwnPropertyDescriptorHelper(VarTo<RecyclableObject>(target), propertyKey, scriptContext);
    }